

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanImplX11.cpp
# Opt level: O2

vector<const_char_*,_std::allocator<const_char_*>_> *
sf::priv::VulkanImplX11::getGraphicsRequiredInstanceExtensions(void)

{
  int iVar1;
  char *local_18;
  
  if (getGraphicsRequiredInstanceExtensions()::extensions == '\0') {
    iVar1 = __cxa_guard_acquire(&getGraphicsRequiredInstanceExtensions()::extensions);
    if (iVar1 != 0) {
      getGraphicsRequiredInstanceExtensions::extensions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      getGraphicsRequiredInstanceExtensions::extensions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      getGraphicsRequiredInstanceExtensions::extensions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector,
                   &getGraphicsRequiredInstanceExtensions::extensions,&__dso_handle);
      __cxa_guard_release(&getGraphicsRequiredInstanceExtensions()::extensions);
    }
  }
  if (getGraphicsRequiredInstanceExtensions::extensions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      getGraphicsRequiredInstanceExtensions::extensions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_18 = "VK_KHR_surface";
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)
               &getGraphicsRequiredInstanceExtensions::extensions,&local_18);
    local_18 = "VK_KHR_xlib_surface";
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)
               &getGraphicsRequiredInstanceExtensions::extensions,&local_18);
  }
  return &getGraphicsRequiredInstanceExtensions::extensions;
}

Assistant:

const std::vector<const char*>& VulkanImplX11::getGraphicsRequiredInstanceExtensions()
{
    static std::vector<const char*> extensions;

    if (extensions.empty())
    {
        extensions.push_back(VK_KHR_SURFACE_EXTENSION_NAME);
        extensions.push_back(VK_KHR_XLIB_SURFACE_EXTENSION_NAME);
    }

    return extensions;
}